

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

mkroom * build_room(level *lev,room *r,mkroom *mkr)

{
  xchar rtype_00;
  int iVar1;
  bool local_41;
  level *plStack_38;
  xchar rtype;
  mkroom *aroom;
  boolean okroom;
  mkroom *mkr_local;
  room *r_local;
  level *lev_local;
  
  if (r->chance != '\0') {
    iVar1 = rn2(100);
    if (r->chance <= iVar1) {
      rtype_00 = '\0';
      goto LAB_002ed198;
    }
  }
  rtype_00 = r->rtype;
LAB_002ed198:
  if (mkr == (mkroom *)0x0) {
    plStack_38 = (level *)(lev->rooms + lev->nroom);
    aroom._7_1_ = create_room(lev,r->x,r->y,r->w,r->h,r->xalign,r->yalign,rtype_00,r->rlit);
  }
  else {
    plStack_38 = (level *)(lev->subrooms + lev->nsubroom);
    aroom._7_1_ = create_subroom(lev,mkr,r->x,r->y,r->w,r->h,rtype_00,r->rlit);
  }
  if (aroom._7_1_ == '\0') {
    lev_local = (level *)0x0;
  }
  else {
    topologize(lev,(mkroom *)plStack_38);
    local_41 = false;
    if (plStack_38->levname[4] != '\0') {
      local_41 = r->filled != '\0';
    }
    plStack_38->levname[6] = local_41;
    lev_local = plStack_38;
  }
  return (mkroom *)lev_local;
}

Assistant:

static struct mkroom *build_room(struct level *lev, room *r, struct mkroom *mkr)
{
	boolean okroom;
	struct mkroom *aroom;
	xchar rtype = (!r->chance || rn2(100) < r->chance) ? r->rtype : OROOM;

	if (mkr) {
	    aroom = &lev->subrooms[lev->nsubroom];
	    okroom = create_subroom(lev, mkr, r->x, r->y, r->w, r->h,
				    rtype, r->rlit);
	} else {
	    aroom = &lev->rooms[lev->nroom];
	    okroom = create_room(lev, r->x, r->y, r->w, r->h, r->xalign,
				 r->yalign, rtype, r->rlit);
	}

	if (okroom) {
	    topologize(lev, aroom);			/* set roomno */
	    aroom->needfill = ((aroom->rtype != OROOM) && r->filled);
	    return aroom;
	}
	return NULL;
}